

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool Curl_alpn_contains_proto(alpn_spec *spec,char *proto)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  size_t local_40;
  size_t slen;
  size_t plen;
  size_t i;
  char *proto_local;
  alpn_spec *spec_local;
  
  if (proto == (char *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = strlen(proto);
  }
  plen = 0;
  while( true ) {
    bVar3 = false;
    if ((spec != (alpn_spec *)0x0) && (bVar3 = false, local_40 != 0)) {
      bVar3 = plen < spec->count;
    }
    if (!bVar3) break;
    sVar2 = strlen(spec->entries[plen]);
    if ((sVar2 == local_40) && (iVar1 = memcmp(proto,spec->entries + plen,local_40), iVar1 == 0)) {
      return true;
    }
    plen = plen + 1;
  }
  return false;
}

Assistant:

bool Curl_alpn_contains_proto(const struct alpn_spec *spec,
                              const char *proto)
{
  size_t i, plen = proto ? strlen(proto) : 0;
  for(i = 0; spec && plen && i < spec->count; ++i) {
    size_t slen = strlen(spec->entries[i]);
    if((slen == plen) && !memcmp(proto, spec->entries[i], plen))
      return TRUE;
  }
  return FALSE;
}